

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_replaceAString_failure_nullptr_fn(int _i)

{
  AString string;
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffea0;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_6;
  void *_ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString rep;
  AString old;
  int _i_local;
  
  private_ACUtilsTest_AString_constructTestString((AString *)&rep.buffer,"xy",2);
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"abc",3);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  private_ACUtilsTest_AString_reallocCount = 0;
  bVar1 = AString_replaceAString((AString *)0x0,(AString *)&rep.buffer,(AString *)&_ck_x,0);
  if (bVar1 != false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x863,
                      "Assertion \'!AString_replaceAString(((void*)0), &old, &rep, 0)\' failed",0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x863);
  if (old.size != 2) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x864,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(old).capacity == (2)",
                      "(old).capacity",old.size,"(2)",2,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x864);
  if (old.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x864,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (old).buffer != NULL",
                      "(void*) (old).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x864);
  if (old.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("xy",(char *)old.capacity);
    _ck_y_s = (char *)old.capacity;
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x864);
      if (old.deallocator != (ACUtilsDeallocator)0x2) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x864,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(old).size == strlen(\"xy\")","(old).size",old.deallocator,
                          "strlen(\"xy\")",2,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x864);
      if (rep.size != 3) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x865,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju","(rep).capacity == (3)",
                          "(rep).capacity",rep.size,"(3)",3,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x865);
      if (rep.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x865,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (rep).buffer != NULL",
                          "(void*) (rep).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x865);
      _ck_y_s_1 = (char *)rep.capacity;
      if (rep.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar2 = strcmp("abc",(char *)rep.capacity);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x865);
          if (rep.deallocator != (ACUtilsDeallocator)0x3) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x865,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(rep).size == strlen(\"abc\")","(rep).size",rep.deallocator,
                              "strlen(\"abc\")",3,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x865);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x866);
            string.deallocator = (ACUtilsDeallocator)0x2;
            string.reallocator = old.reallocator;
            string.size = 2;
            string.capacity = old.capacity;
            string.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string);
            string_00.deallocator = rep.deallocator;
            string_00.reallocator = rep.reallocator;
            string_00.size = rep.size;
            string_00.capacity = rep.capacity;
            string_00.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string_00);
            return;
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x866,"Assertion \'_ck_x == _ck_y\' failed",
                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                            "private_ACUtilsTest_AString_reallocCount == (0)",
                            "private_ACUtilsTest_AString_reallocCount",
                            private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x865,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(rep).buffer == (\"abc\")","(rep).buffer",_ck_y_q_1,_ck_y_s_1,_ck_y_q_1,
                        "(\"abc\")","\"","abc","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x864,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(old).buffer == (\"xy\")","(old).buffer",_ck_y_q,_ck_y_s,_ck_y_q,"(\"xy\")",
                    "\"","xy","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceAString_failure_nullptr)
{
    struct AString old = private_ACUtilsTest_AString_constructTestString("xy", 2);
    struct AString rep = private_ACUtilsTest_AString_constructTestString("abc", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    private_ACUtilsTest_AString_reallocCount = 0;
    ACUTILSTEST_ASSERT(!AString_replaceAString(nullptr, &old, &rep, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(old, "xy", 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(rep, "abc", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(old);
    private_ACUtilsTest_AString_destructTestString(rep);
}